

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O2

blargg_err_t __thiscall Gme_File::load(Gme_File *this,Data_Reader *in)

{
  int iVar1;
  undefined4 extraout_var;
  blargg_err_t pcVar2;
  
  (*this->_vptr_Gme_File[6])();
  iVar1 = (*this->_vptr_Gme_File[3])(this,in);
  pcVar2 = post_load(this,(blargg_err_t)CONCAT44(extraout_var,iVar1));
  return pcVar2;
}

Assistant:

blargg_err_t Gme_File::load( Data_Reader& in )
{
	pre_load();
	return post_load( load_( in ) );
}